

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_extensions.cpp
# Opt level: O1

shared_ptr<ONX_Model> __thiscall ONX_ModelTest::ReadWriteReadModel(ONX_ModelTest *this)

{
  long lVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  wchar_t *pwVar2;
  long lVar3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  long in_RSI;
  shared_ptr<ONX_Model> sVar4;
  
  lVar1 = *(long *)(in_RSI + 0xf0);
  this_00 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(in_RSI + 0xf8);
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_00->_M_use_count = this_00->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_00->_M_use_count = this_00->_M_use_count + 1;
    }
  }
  if (lVar1 != 0) {
    lVar3 = 0;
    do {
      in_RDX._M_pi = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(in_RSI + 0x100 + lVar3);
      if ((in_RDX._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
         ((in_RDX._M_pi)->_M_use_count == *(int *)(lVar1 + 8))) {
        *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)this = in_RDX._M_pi;
        pwVar2 = *(wchar_t **)(in_RSI + 0x108 + lVar3);
        (this->m_source_3dm_file_path).m_s = pwVar2;
        if (pwVar2 != (wchar_t *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            pwVar2[2] = pwVar2[2] + L'\x01';
            UNLOCK();
          }
          else {
            pwVar2[2] = pwVar2[2] + L'\x01';
          }
        }
        goto LAB_0046ced2;
      }
      lVar3 = lVar3 + 0x10;
    } while (lVar3 != 0x20);
  }
  *(undefined8 *)this = 0;
  (this->m_source_3dm_file_path).m_s = (wchar_t *)0x0;
LAB_0046ced2:
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    in_RDX._M_pi = extraout_RDX;
  }
  sVar4.super___shared_ptr<ONX_Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = in_RDX._M_pi;
  sVar4.super___shared_ptr<ONX_Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<ONX_Model>)sVar4.super___shared_ptr<ONX_Model,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<ONX_Model> ONX_ModelTest::ReadWriteReadModel() const
{
  const auto source_model = SourceModel();
  if (nullptr != source_model)
  {
    for (int i = 1; i < 3; i++)
    {
      const ONX_Model* copy_model = m_model[i].get();
      if (nullptr == copy_model)
        continue;
      if (copy_model->m_3dm_file_version != source_model->m_3dm_file_version)
        continue;
      return m_model[i];
    }
  }
  std::shared_ptr<ONX_Model> nullsp;
  return nullsp;
}